

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O0

void __thiscall transition_invoke_action_0_Test::TestBody(transition_invoke_action_0_Test *this)

{
  undefined1 local_14 [4];
  e1 e;
  s1 s;
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:173:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>
  transition;
  transition_invoke_action_0_Test *this_local;
  
  _e = this;
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_invoke_action_0_Test::TestBody()::__0,state_machine::transition::State<(anonymous_namespace)::s2>>
            (&state_machine::placeholder::_,local_14);
  return;
}

Assistant:

TEST(transition, invoke_action_0) {
    auto transition = make_transition(
        state<s1>, event<e1>, _, [] { return s2{}; }, state<s2>);

    auto s = s1{};
    auto e = e1{};

    static_assert(std::is_same<decltype(transition.action()), s2>::value, "");
    static_assert(std::is_same<decltype(transition.invoke_action(s, e)), s2>::value, "");
}